

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::Convert
          (string *__return_storage_ptr__,cmOutputConverter *this,string *source,
          RelativeRoot relative,OutputFormat output)

{
  cmState *pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_68;
  undefined1 local_48 [8];
  string result;
  OutputFormat output_local;
  RelativeRoot relative_local;
  string *source_local;
  cmOutputConverter *this_local;
  
  result.field_2._8_4_ = output;
  result.field_2._12_4_ = relative;
  std::__cxx11::string::string((string *)local_48,(string *)source);
  switch(result.field_2._12_4_) {
  case 0:
    break;
  case 1:
    cmsys::SystemTools::CollapseFullPath(&local_f8,(string *)local_48);
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    break;
  case 2:
    pcVar1 = GetState(this);
    pvVar2 = cmState::GetSourceDirectoryComponents_abi_cxx11_(pcVar1);
    ConvertToRelativePath(&local_68,this,pvVar2,(string *)local_48,false);
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    break;
  case 3:
    pvVar2 = cmState::Snapshot::GetCurrentSourceDirectoryComponents_abi_cxx11_(&this->StateSnapshot)
    ;
    ConvertToRelativePath(&local_98,this,pvVar2,(string *)local_48,false);
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    break;
  case 4:
    pcVar1 = GetState(this);
    pvVar2 = cmState::GetBinaryDirectoryComponents_abi_cxx11_(pcVar1);
    ConvertToRelativePath(&local_b8,this,pvVar2,(string *)local_48,false);
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    break;
  case 5:
    pvVar2 = cmState::Snapshot::GetCurrentBinaryDirectoryComponents_abi_cxx11_(&this->StateSnapshot)
    ;
    ConvertToRelativePath(&local_d8,this,pvVar2,(string *)local_48,false);
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  ConvertToOutputFormat(__return_storage_ptr__,this,(string *)local_48,result.field_2._8_4_);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::Convert(const std::string& source,
                                       RelativeRoot relative,
                                       OutputFormat output) const
{
  // Convert the path to a relative path.
  std::string result = source;

  switch (relative)
    {
  case HOME:
    result = this->ConvertToRelativePath(
          this->GetState()->GetSourceDirectoryComponents(), result);
    break;
  case START:
    result = this->ConvertToRelativePath(
          this->StateSnapshot.GetCurrentSourceDirectoryComponents(), result);
    break;
  case HOME_OUTPUT:
    result = this->ConvertToRelativePath(
          this->GetState()->GetBinaryDirectoryComponents(), result);
    break;
  case START_OUTPUT:
    result = this->ConvertToRelativePath(
          this->StateSnapshot.GetCurrentBinaryDirectoryComponents(), result);
    break;
  case FULL:
    result = cmSystemTools::CollapseFullPath(result);
    break;
  case NONE:
    break;
    }
  return this->ConvertToOutputFormat(result, output);
}